

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall cxxopts::exceptions::no_such_option::~no_such_option(no_such_option *this)

{
  exception::~exception((exception *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit no_such_option(const std::string& option)
  : parsing("Option " + LQUOTE + option + RQUOTE + " does not exist")
  {
  }